

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QGraphicsItemCache * __thiscall
QGraphicsItemPrivate::maybeExtraItemCache(QGraphicsItemPrivate *this)

{
  ulong uVar1;
  ExtraStruct *pEVar2;
  bool bVar3;
  QMetaType QVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  undefined8 uVar6;
  ExtraStruct *pEVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  void *t;
  QMetaType local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->extras).d.size;
  if (uVar1 != 0) {
    pEVar7 = (this->extras).d.ptr;
    if (pEVar7->type == ExtraCacheData) {
      ::QVariant::QVariant((QVariant *)&local_38,&pEVar7->value);
      goto LAB_005ed9a8;
    }
    uVar8 = 0;
    do {
      pEVar2 = pEVar7;
      pEVar7 = pEVar2 + 1;
      if (uVar1 - 1 == uVar8) goto LAB_005ed98e;
      uVar8 = uVar8 + 1;
    } while (pEVar7->type != ExtraCacheData);
    ::QVariant::QVariant((QVariant *)&local_38,&pEVar2[1].value);
    if (uVar8 < uVar1) goto LAB_005ed9a8;
  }
LAB_005ed98e:
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
LAB_005ed9a8:
  local_40.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
  local_48.d_ptr = (QMetaTypeInterface *)(local_20 & 0xfffffffffffffffc);
  bVar3 = comparesEqual(&local_48,&local_40);
  if (bVar3) {
    uVar6 = local_38.shared;
    if ((local_20 & 1) != 0) {
      uVar6 = *(undefined8 *)(local_38.shared + *(int *)(local_38.shared + 4));
    }
  }
  else {
    local_48.d_ptr = (QMetaTypeInterface *)0x0;
    paVar5 = &local_38;
    QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_20 & 1) != 0) {
      paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_38.shared + *(int *)(local_38.shared + 4));
    }
    QMetaType::convert(QVar4,paVar5,local_40,&local_48);
    uVar6 = local_48.d_ptr;
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QGraphicsItemCache *)(QMetaTypeInterface *)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::maybeExtraItemCache() const
{
    return (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
}